

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int add_int(int_list *ilist,int val)

{
  int *piVar1;
  int val_local;
  int_list *ilist_local;
  
  if (ilist->len == 0) {
    ilist->list = (int *)0x0;
  }
  ilist->len = ilist->len + 1;
  piVar1 = (int *)realloc(ilist->list,(long)ilist->len << 2);
  ilist->list = piVar1;
  if (ilist->list == (int *)0x0) {
    fprintf(_stderr,"** failed to alloc %d (int *) elements\n",(ulong)(uint)ilist->len);
    ilist_local._4_4_ = -1;
  }
  else {
    ilist->list[ilist->len + -1] = val;
    ilist_local._4_4_ = 0;
  }
  return ilist_local._4_4_;
}

Assistant:

int add_int(int_list * ilist, int val)
{
   if( ilist->len == 0 ) ilist->list = NULL;  /* just to be safe */
   ilist->len++;
   ilist->list = (int *)realloc(ilist->list,ilist->len*sizeof(int));
   if( ! ilist->list ){
      fprintf(stderr,"** failed to alloc %d (int *) elements\n",ilist->len);
      return -1;
   }

   ilist->list[ilist->len-1] = val;

   return 0;
}